

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintDefinition(DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                    *this,ostream *os)

{
  ParamNames *pPVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *this_00;
  Statement *stmt;
  ExprBase *expr;
  ulong local_58;
  size_t ndx;
  string local_40 [32];
  ParamNames *local_20;
  ParamNames *paramNames;
  ostream *os_local;
  DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  paramNames = (ParamNames *)os;
  os_local = (ostream *)this;
  local_20 = Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
             ::getParamNames_abi_cxx11_
                       ((Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                         *)this);
  initialize(this);
  pPVar1 = paramNames;
  pcVar3 = dataTypeNameOf<tcu::Vector<float,4>>();
  poVar4 = std::operator<<((ostream *)pPVar1,pcVar3);
  poVar4 = std::operator<<(poVar4," ");
  (*(this->
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])();
  poVar4 = std::operator<<(poVar4,local_40);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string(local_40);
  bVar2 = isTypeValid<tcu::Vector<float,4>>();
  pPVar1 = paramNames;
  if (bVar2) {
    pcVar3 = dataTypeNameOf<tcu::Vector<float,4>>();
    poVar4 = std::operator<<((ostream *)pPVar1,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)local_20);
  }
  bVar2 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<deqp::gls::BuiltinPrecisionTests::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->b);
  }
  bVar2 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<deqp::gls::BuiltinPrecisionTests::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->c);
  }
  bVar2 = isTypeValid<deqp::gls::BuiltinPrecisionTests::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<deqp::gls::BuiltinPrecisionTests::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->d);
  }
  std::operator<<((ostream *)paramNames,")\n{\n");
  for (local_58 = 0;
      sVar5 = std::
              vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
              ::size(&this->m_body), pPVar1 = paramNames, local_58 < sVar5; local_58 = local_58 + 1)
  {
    this_00 = &std::
               vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ::operator[](&this->m_body,local_58)->
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>;
    stmt = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::operator*(this_00);
    BuiltinPrecisionTests::operator<<((ostream *)pPVar1,stmt);
  }
  poVar4 = std::operator<<((ostream *)paramNames,"return ");
  expr = &de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::
          operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>
                     *)&this->m_ret)->super_ExprBase;
  poVar4 = BuiltinPrecisionTests::operator<<(poVar4,expr);
  std::operator<<(poVar4,";\n");
  std::operator<<((ostream *)paramNames,"}\n");
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}